

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.h
# Opt level: O0

__m128 glmm_vhadds(__m128 v)

{
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  __m128 afVar1;
  __m128 sums;
  __m128 shuf;
  __m128 v_local;
  undefined8 local_18;
  
  afVar1[2] = in_XMM0_Dc + in_XMM0_Dd;
  afVar1[0] = v[0] + v[1] + in_XMM0_Dc + in_XMM0_Dd;
  afVar1[1] = v[1] + v[0];
  afVar1[3] = 0.0;
  return afVar1;
}

Assistant:

static inline
__m128
glmm_vhadds(__m128 v) {
#if defined(__SSE3__)
  __m128 shuf, sums;
  shuf = _mm_movehdup_ps(v);
  sums = _mm_add_ps(v, shuf);
  shuf = _mm_movehl_ps(shuf, sums);
  sums = _mm_add_ss(sums, shuf);
  return sums;
#else
  __m128 shuf, sums;
  shuf = glmm_shuff1(v, 2, 3, 0, 1);
  sums = _mm_add_ps(v, shuf);
  shuf = _mm_movehl_ps(shuf, sums);
  sums = _mm_add_ss(sums, shuf);
  return sums;
#endif
}